

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::VirtualInputNodeTask::inputsAvailable
          (VirtualInputNodeTask *this,TaskInterface ti)

{
  TaskInterface local_b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  BuildValue local_88;
  
  local_b0.ctx = ti.ctx;
  local_b0.impl = ti.impl;
  local_88.kind = VirtualInput;
  local_88._4_8_ = 0;
  local_88._12_8_ = 0;
  local_88.valueData._4_8_ = 0;
  local_88.valueData._12_8_ = 0;
  local_88.valueData._20_8_ = 0;
  local_88.valueData._28_8_ = 0;
  local_88.valueData._36_8_ = 0;
  local_88.valueData._44_8_ = 0;
  local_88.valueData._52_8_ = 0;
  local_88.valueData._60_8_ = 0;
  local_88.valueData._68_8_ = 0;
  local_88.valueData._76_4_ = 0;
  local_88.stringValues.contents._0_4_ = 0;
  local_88.stringValues.contents._4_4_ = 0;
  local_88.stringValues.size = 0;
  llbuild::buildsystem::BuildValue::toData((ValueType *)&local_a0,&local_88);
  llbuild::core::TaskInterface::complete(&local_b0,(ValueType *)&local_a0,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_88);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    ti.complete(BuildValue::makeVirtualInput().toData());
  }